

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

int __thiscall PInt::GetValueInt(PInt *this,void *addr)

{
  uint local_38;
  uint local_34;
  void *addr_local;
  PInt *this_local;
  
  if (((ulong)addr & (ulong)(*(int *)&this->field_0x28 - 1)) != 0) {
    __assert_fail("((intptr_t)addr & (Align - 1)) == 0 && \"unaligned address\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobjtype.cpp"
                  ,0x3a3,"virtual int PInt::GetValueInt(void *) const");
  }
  if (*(int *)&this->field_0x24 == 4) {
    this_local._4_4_ = *addr;
  }
  else if (*(int *)&this->field_0x24 == 1) {
    if ((this->Unsigned & 1U) == 0) {
      local_34 = (uint)*addr;
    }
    else {
      local_34 = (uint)*addr;
    }
    this_local._4_4_ = local_34;
  }
  else if (*(int *)&this->field_0x24 == 2) {
    if ((this->Unsigned & 1U) == 0) {
      local_38 = (uint)*addr;
    }
    else {
      local_38 = (uint)*addr;
    }
    this_local._4_4_ = local_38;
  }
  else {
    if (*(int *)&this->field_0x24 != 8) {
      __assert_fail("0 && \"Unhandled integer size\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobjtype.cpp"
                    ,0x3b6,"virtual int PInt::GetValueInt(void *) const");
    }
    this_local._4_4_ = (uint)*addr;
  }
  return this_local._4_4_;
}

Assistant:

int PInt::GetValueInt(void *addr) const
{
	assert(((intptr_t)addr & (Align - 1)) == 0 && "unaligned address");
	if (Size == 4)
	{
		return *(int *)addr;
	}
	else if (Size == 1)
	{
		return Unsigned ? *(BYTE *)addr : *(SBYTE *)addr;
	}
	else if (Size == 2)
	{
		return Unsigned ? *(WORD *)addr : *(SWORD *)addr;
	}
	else if (Size == 8)
	{ // truncated output
		return (int)*(QWORD *)addr;
	}
	else
	{
		assert(0 && "Unhandled integer size");
		return 0;
	}
}